

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O1

int __thiscall Fl_Check_Browser::remove(Fl_Check_Browser *this,char *__filename)

{
  cb_item *pcVar1;
  cb_item *item;
  cb_item *pcVar2;
  cb_item **ppcVar3;
  
  item = find_item(this,(int)__filename);
  if (item != (cb_item *)0x0) {
    Fl_Browser_::deleting(&this->super_Fl_Browser_,item);
    if (item->checked != '\0') {
      this->nchecked_ = this->nchecked_ + -1;
    }
    pcVar1 = item->prev;
    pcVar2 = (cb_item *)&this->first;
    if (pcVar1 != (cb_item *)0x0) {
      pcVar2 = pcVar1;
    }
    pcVar2->next = item->next;
    ppcVar3 = &item->next->prev;
    if (item->next == (cb_item *)0x0) {
      ppcVar3 = &this->last;
    }
    *ppcVar3 = pcVar1;
    free(item->text);
    free(item);
    this->nitems_ = this->nitems_ + -1;
    this->cached_item = -1;
  }
  return this->nitems_;
}

Assistant:

int Fl_Check_Browser::remove(int item) {
  cb_item *p = find_item(item);
  
  // line at item exists
  if(p) {
    // tell the Browser_ what we will do
    deleting(p);

    // fix checked count
    if(p->checked)
      --nchecked_;
    
    // remove the node
    if (p->prev) 
      p->prev->next = p->next;
    else 
      first = p->next;
    if (p->next) 
      p->next->prev = p->prev;
    else 
      last = p->prev;
    
    free(p->text);
    free(p);
    
    --nitems_;
    cached_item = -1;
  }
  
  return (nitems_);
}